

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_key_agreement_raw_internal
          (psa_algorithm_t alg,psa_key_slot_t *private_key,uint8_t *peer_key,size_t peer_key_length,
          uint8_t *shared_secret,size_t shared_secret_size,size_t *shared_secret_length)

{
  size_t shared_secret_size_local;
  uint8_t *shared_secret_local;
  size_t peer_key_length_local;
  uint8_t *peer_key_local;
  psa_key_slot_t *private_key_local;
  psa_algorithm_t alg_local;
  
  if (alg == 0x30200000) {
    if (((private_key->attr).type & 0xff00) == 0x7100) {
      private_key_local._4_4_ =
           psa_key_agreement_ecdh
                     (peer_key,peer_key_length,(private_key->data).ecp,shared_secret,
                      shared_secret_size,shared_secret_length);
    }
    else {
      private_key_local._4_4_ = -0x87;
    }
  }
  else {
    private_key_local._4_4_ = -0x86;
  }
  return private_key_local._4_4_;
}

Assistant:

static psa_status_t psa_key_agreement_raw_internal( psa_algorithm_t alg,
                                                    psa_key_slot_t *private_key,
                                                    const uint8_t *peer_key,
                                                    size_t peer_key_length,
                                                    uint8_t *shared_secret,
                                                    size_t shared_secret_size,
                                                    size_t *shared_secret_length )
{
    switch( alg )
    {
#if defined(MBEDTLS_ECDH_C)
        case PSA_ALG_ECDH:
            if( ! PSA_KEY_TYPE_IS_ECC_KEY_PAIR( private_key->attr.type ) )
                return( PSA_ERROR_INVALID_ARGUMENT );
            return( psa_key_agreement_ecdh( peer_key, peer_key_length,
                                            private_key->data.ecp,
                                            shared_secret, shared_secret_size,
                                            shared_secret_length ) );
#endif /* MBEDTLS_ECDH_C */
        default:
            (void) private_key;
            (void) peer_key;
            (void) peer_key_length;
            (void) shared_secret;
            (void) shared_secret_size;
            (void) shared_secret_length;
            return( PSA_ERROR_NOT_SUPPORTED );
    }
}